

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

size_t __thiscall MallocBlock::actual_data_size(MallocBlock *this,void *raw_ptr)

{
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  char *pcVar1;
  size_t sVar2;
  LogItem a;
  LogItem a_00;
  LogItem a_01;
  LogItem local_e8;
  LogItem local_d8;
  LogItem local_c8;
  LogItem local_b8;
  LogItem local_a8;
  LogItem local_98;
  LogItem local_88;
  LogItem local_78;
  LogItem local_68;
  LogItem local_58;
  LogItem local_48;
  LogItem local_38;
  char *local_28;
  char *raw_end;
  char *raw_begin;
  void *raw_ptr_local;
  MallocBlock *this_local;
  
  raw_begin = (char *)raw_ptr;
  raw_ptr_local = this;
  pcVar1 = (char *)data_addr(this);
  raw_end = pcVar1;
  sVar2 = raw_data_size(this);
  local_28 = pcVar1 + sVar2;
  if (local_28 < raw_end) {
    tcmalloc::LogItem::LogItem(&local_38,"raw_begin <= raw_end");
    tcmalloc::LogItem::LogItem(&local_48);
    tcmalloc::LogItem::LogItem(&local_58);
    tcmalloc::LogItem::LogItem(&local_68);
    a._4_4_ = 0;
    a.tag_ = local_38.tag_;
    b.u_.str = local_48.u_.str;
    b.tag_ = local_48.tag_;
    b._4_4_ = local_48._4_4_;
    c.u_.str = local_58.u_.str;
    c.tag_ = local_58.tag_;
    c._4_4_ = local_58._4_4_;
    d.u_.str = local_68.u_.str;
    d.tag_ = local_68.tag_;
    d._4_4_ = local_68._4_4_;
    a.u_.str = local_38.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,0x1f1,a,b,c,d);
    do {
    } while( true );
  }
  if (raw_begin < raw_end) {
    tcmalloc::LogItem::LogItem(&local_78,"raw_begin <= raw_ptr");
    tcmalloc::LogItem::LogItem(&local_88);
    tcmalloc::LogItem::LogItem(&local_98);
    tcmalloc::LogItem::LogItem(&local_a8);
    a_00._4_4_ = 0;
    a_00.tag_ = local_78.tag_;
    b_00.u_.str = local_88.u_.str;
    b_00.tag_ = local_88.tag_;
    b_00._4_4_ = local_88._4_4_;
    c_00.u_.str = local_98.u_.str;
    c_00.tag_ = local_98.tag_;
    c_00._4_4_ = local_98._4_4_;
    d_00.u_.str = local_a8.u_.str;
    d_00.tag_ = local_a8.tag_;
    d_00._4_4_ = local_a8._4_4_;
    a_00.u_.str = local_78.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,0x1f2,a_00,b_00,c_00,d_00);
    do {
    } while( true );
  }
  if (local_28 < raw_begin) {
    tcmalloc::LogItem::LogItem(&local_b8,"raw_ptr <= raw_end");
    tcmalloc::LogItem::LogItem(&local_c8);
    tcmalloc::LogItem::LogItem(&local_d8);
    tcmalloc::LogItem::LogItem(&local_e8);
    a_01._4_4_ = 0;
    a_01.tag_ = local_b8.tag_;
    b_01.u_.str = local_c8.u_.str;
    b_01.tag_ = local_c8.tag_;
    b_01._4_4_ = local_c8._4_4_;
    c_01.u_.str = local_d8.u_.str;
    c_01.tag_ = local_d8.tag_;
    c_01._4_4_ = local_d8._4_4_;
    d_01.u_.str = local_e8.u_.str;
    d_01.tag_ = local_e8.tag_;
    d_01._4_4_ = local_e8._4_4_;
    a_01.u_.str = local_b8.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/debugallocation.cc"
                  ,499,a_01,b_01,c_01,d_01);
    do {
    } while( true );
  }
  return (long)local_28 - (long)raw_begin;
}

Assistant:

size_t actual_data_size(const void* raw_ptr) const {
    const char* raw_begin = static_cast<const char*>(data_addr());
    const char* raw_end = raw_begin + raw_data_size();
    CHECK_CONDITION(raw_begin <= raw_end);
    CHECK_CONDITION(raw_begin <= raw_ptr);
    CHECK_CONDITION(raw_ptr <= raw_end);

    return raw_end - static_cast<const char*>(raw_ptr);
  }